

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

BeliefSetNonStationary * __thiscall
AlphaVectorPlanning::SampleBeliefsNonStationary
          (BeliefSetNonStationary *__return_storage_ptr__,AlphaVectorPlanning *this,int nrBeliefs,
          int uniqueBeliefs,int resetAfter,int useQMDPforSamplingBeliefs,double QMDPexploreProb)

{
  size_t sVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar11;
  PlanningUnitDecPOMDPDiscrete *pPVar12;
  undefined8 uVar13;
  E *this_00;
  undefined4 in_register_00000014;
  int iVar14;
  allocator<char> local_91;
  AlphaVectorPlanning *local_90;
  JointBeliefInterface *local_88;
  ulong local_80;
  BeliefSetNonStationary *local_78;
  long *local_70;
  int local_64;
  int local_60;
  int local_5c;
  double local_58;
  string local_50;
  
  local_80 = CONCAT44(in_register_00000014,nrBeliefs);
  local_78 = __return_storage_ptr__;
  local_64 = uniqueBeliefs;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"SampleBeliefsNonStationary",&local_91);
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pPVar12 = this->_m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (this->_m_puShared).px;
  }
  sVar1 = (pPVar12->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  local_90 = this;
  sVar10 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar12->super_PlanningUnitMADPDiscrete);
  pPVar12 = local_90->_m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (local_90->_m_puShared).px;
  }
  iVar5 = (**(code **)((long)*(pPVar12->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar12 = local_90->_m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (local_90->_m_puShared).px;
  }
  iVar6 = (*(pPVar12->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar12,(long)(int)sVar10);
  local_70 = (long *)CONCAT44(extraout_var,iVar6);
  pPVar12 = local_90->_m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (local_90->_m_puShared).px;
  }
  iVar6 = (*(pPVar12->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar12,(long)(int)sVar10);
  local_88 = (JointBeliefInterface *)CONCAT44(extraout_var_00,iVar6);
  iVar6 = (int)sVar1;
  if ((int)local_80 <= iVar6) {
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "AlphaVectorPlanning::SampleBeliefsNonStationary need to sample at least one belief for each time step, sampling "
                             );
    local_80 = (ulong)(iVar6 + 1U);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar6 + 1U);
    poVar11 = std::operator<<(poVar11," beliefs");
    std::endl<char,std::char_traits<char>>(poVar11);
  }
  if (iVar6 != 999999) {
    BeliefSetNonStationary::BeliefSetNonStationary(local_78,(long)iVar6);
    local_58 = (double)iVar5;
    if (resetAfter == 0) {
      resetAfter = iVar6;
    }
    local_60 = resetAfter;
    if (iVar6 < resetAfter) {
      local_60 = iVar6;
    }
    iVar14 = 0;
    iVar6 = 0;
    uVar8 = 0;
    local_5c = (int)local_80 * 2;
    for (iVar5 = 0; (iVar6 < (int)local_80 && (iVar5 < local_5c)); iVar5 = iVar5 + (uint)!bVar4) {
      if (local_60 < iVar14) {
        iVar14 = 0;
      }
      if (iVar14 == 0) {
        pPVar12 = local_90->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (local_90->_m_puShared).px;
        }
        pDVar2 = pPVar12->_m_DecPOMDP;
        uVar8 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8)
                                      ) + 0x160))
                          ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8));
        pPVar12 = local_90->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (local_90->_m_puShared).px;
        }
        lVar3 = *(long *)((long)*local_88 + -0xb8);
        uVar13 = (**(code **)((long)*(pPVar12->super_PlanningUnitMADPDiscrete)._m_madp + 0x50))();
        (**(code **)(*(long *)((long)&local_88->field_0x0 + lVar3) + 0x28))
                  ((long)&local_88->field_0x0 + lVar3,uVar13);
      }
      else {
        iVar7 = rand();
        pPVar12 = local_90->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (local_90->_m_puShared).px;
        }
        pDVar2 = pPVar12->_m_DecPOMDP;
        iVar7 = (int)((double)iVar7 * 4.656612873077393e-10 * local_58);
        uVar8 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8)
                                      ) + 0x148))
                          ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8),uVar8,iVar7
                          );
        pPVar12 = local_90->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (local_90->_m_puShared).px;
        }
        pDVar2 = pPVar12->_m_DecPOMDP;
        uVar9 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8)
                                      ) + 0x150))
                          ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8),iVar7,uVar8
                          );
        (**(code **)((long)*local_88 + 0xa8))(local_88,local_70);
        pPVar12 = local_90->_m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (local_90->_m_puShared).px;
        }
        (**(code **)((long)*local_88 + 0xb0))
                  (local_88,(long)&pPVar12->_m_DecPOMDP->field_0x0 +
                            *(long *)(*(long *)pPVar12->_m_DecPOMDP + -0xb8),iVar7,uVar9);
      }
      bVar4 = BeliefSetNonStationary::Add(local_78,(long)iVar14,local_88,local_64 != 0);
      iVar14 = iVar14 + 1;
      iVar6 = iVar6 + (uint)bVar4;
      (**(code **)(*local_70 + 0xa8))(local_70,local_88);
    }
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
    if (local_88 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*local_88 + 8))();
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"SampleBeliefsNonStationary",&local_91);
    TimedAlgorithm::StopTimer(&local_90->super_TimedAlgorithm,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (iVar6 < (int)local_80) {
      poVar11 = std::operator<<((ostream *)&std::cout,"Warning, only managed to sample ");
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar6);
      poVar11 = std::operator<<(poVar11," unique beliefs instead of ");
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,(int)local_80);
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    return local_78;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "AlphaVectorPlanning::SampleBeliefsNonStationary does not make sense in an infinite-horizon setting"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

BeliefSetNonStationary
AlphaVectorPlanning::SampleBeliefsNonStationary(
    int nrBeliefs,
    int uniqueBeliefs,
    int resetAfter,
    int useQMDPforSamplingBeliefs,
    double QMDPexploreProb) const
{
    StartTimer("SampleBeliefsNonStationary");
    
    int h=GetPU()->GetHorizon(),
        nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        i,d=0;
    Index a;
    Index o;
    Index s0=0,s1;
    JointBeliefInterface *b0p, *b1p;
    b0p = GetPU()->GetNewJointBeliefInterface(nrS);
    b1p = GetPU()->GetNewJointBeliefInterface(nrS);
    JointBeliefInterface& b0 = *b0p;
    JointBeliefInterface& b1 = *b1p;

    if(nrBeliefs<=h)
    {
        nrBeliefs=h+1;
        cout << "AlphaVectorPlanning::SampleBeliefsNonStationary need to sample at least one belief for each time step, sampling " << h+1 << " beliefs" << endl;
    }

    if(h==static_cast<int>(MAXHORIZON))
        throw(E("AlphaVectorPlanning::SampleBeliefsNonStationary does not make sense in an infinite-horizon setting"));

    BeliefSetNonStationary S(h);

    int nrEqualFound=0;

    // we don't want to artificially reset the problem
    if(resetAfter==0)
        resetAfter=h;

    i=0;
    // make sure we don't try to keep on sampling beliefs if there are
    // not enough unique beliefs (<nrBeliefs)
    while(i<nrBeliefs && nrEqualFound<(nrBeliefs*2))
    {
        // reset the problem if either we exceeded the horizon, or the
        // user-supplied parameter (used in the infinite-horizon case)
        if(d>h || d>resetAfter)
            d=0;

        if(d==0)
        {
            s1=GetPU()->GetDPOMDPD()->SampleInitialState();
            b1.Set(* GetPU()->GetProblem()->GetISD());
        }
        else
        {
            // sample an action uniformly at random
            a=static_cast<int>(nrA*(rand() / (RAND_MAX + 1.0)));

            s1=GetPU()->GetDPOMDPD()->SampleSuccessorState(s0,a);
            o=GetPU()->GetDPOMDPD()->SampleJointObservation(a,s1);

            b1=b0;
            b1.Update(*GetPU()->GetDPOMDPD(),a,o);
        }

        if(S.Add(d,b1,uniqueBeliefs)) // we add it
            i++;
        else
            nrEqualFound++;

        d++;
        s0=s1;
        b0=b1;
    }

    delete b0p;
    delete b1p;

    StopTimer("SampleBeliefsNonStationary");

    // we did not manage to sample nrBeliefs unique beliefs
    if(i<nrBeliefs)
    {
        cout << "Warning, only managed to sample " << i 
             << " unique beliefs instead of " << nrBeliefs << endl;
    }

    return(S);
}